

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

string * __thiscall
pbrt::SpectrumPtexTexture::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SpectrumPtexTexture *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string local_30;
  
  PtexTextureBase::BaseToString_abi_cxx11_(&local_30,&this->super_PtexTextureBase);
  StringPrintf<std::__cxx11::string>
            (__return_storage_ptr__,(pbrt *)"[ SpectrumPtexTexture %s ]",(char *)&local_30,in_RCX);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string SpectrumPtexTexture::ToString() const {
    return StringPrintf("[ SpectrumPtexTexture %s ]", BaseToString());
}